

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

void __thiscall Parser::~Parser(Parser *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->sex)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sex).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->star)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->star).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->animal)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->animal).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->address)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->address).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->id)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->id).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->provfile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->provfile).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->dir)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->dir).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Parser(std::string str) :
            id(str), address(""), year(0), month(0), day(0), animal(""), star(""), sex("") {}